

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O1

double TasGrid::RuleLocal::diffSupport<(TasGrid::RuleLocal::erule)4>
                 (int max_order,int point,double x,bool *isSupported)

{
  double dVar1;
  int result;
  int iVar2;
  uint uVar3;
  double dVar4;
  
  dVar4 = scaleX<(TasGrid::RuleLocal::erule)4>(point,x);
  if ((dVar4 < -1.0) || (1.0 <= dVar4)) {
    *isSupported = dVar4 == 1.0 && x == 1.0;
    if (dVar4 != 1.0 || x != 1.0) {
      return 0.0;
    }
  }
  else {
    *isSupported = true;
  }
  if ((uint)point < 3) {
    dVar1 = *(double *)(&DAT_001d0928 + (ulong)(uint)point * 8);
  }
  else {
    uVar3 = point - 1;
    iVar2 = 1;
    do {
      uVar3 = (int)uVar3 >> 1;
      iVar2 = iVar2 * 2;
    } while (1 < uVar3);
    dVar1 = (double)iVar2;
  }
  if (max_order == 3) {
    if (point == 0) {
LAB_0019aa76:
      dVar4 = -1.0;
      goto LAB_0019aa88;
    }
    if (point == 2) {
LAB_0019aa80:
      dVar4 = dVar4 * -2.0;
      goto LAB_0019aa88;
    }
    if (point != 1) {
      if ((point & 1U) == 0) {
        dVar4 = 0.3333333333333333 - (dVar4 + 2.0) * dVar4;
      }
      else {
        dVar4 = (dVar4 + -2.0) * dVar4 + -0.3333333333333333;
      }
      goto LAB_0019aa88;
    }
  }
  else {
    if (max_order != 2) {
      if (max_order == 1) {
        return (double)(~-(ulong)(0.0 <= dVar4) & (ulong)dVar1 |
                       (ulong)-dVar1 & -(ulong)(0.0 <= dVar4));
      }
      dVar4 = diffPWPower<(TasGrid::RuleLocal::erule)4>(max_order,point,dVar4);
      goto LAB_0019aa88;
    }
    if (point == 0) goto LAB_0019aa76;
    if (point != 1) goto LAB_0019aa80;
  }
  dVar4 = 1.0;
LAB_0019aa88:
  return dVar1 * dVar4;
}

Assistant:

double diffSupport(int max_order, int point, double x, bool &isSupported) {
        switch(effrule) {
            case erule::pwc:
                isSupported = false;
                return 0.0;
            case erule::localp: {
                if (point == 0) { isSupported = true; return 0.0; }
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return (x == 1.0 and point == 2) ? an : (((xn >= 0 ? -1.0 : 1.0) * an));
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
            case erule::semilocalp:
                switch(point) {
                    case 0: { isSupported = true; return 0.0; }
                    case 1: { isSupported = true; return x - 0.5; }
                    case 2: { isSupported = true; return x + 0.5; }
                    default: {
                        double xn = scaleX<effrule>(point, x);
                        isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                        if (isSupported) {
                            double an = scaleDiffX<effrule>(point);
                            switch(max_order) {
                                case 2: return an * diffPWQuadratic<effrule>(point, xn);
                                case 3: return an * diffPWCubic<effrule>(point, xn);
                                default:
                                    return an * diffPWPower<effrule>(max_order, point, xn);
                            };
                        } else {
                            return 0.0;
                        }
                    }
                };
            case erule::localp0: {
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return (x == 1.0 and point == 0) ? -1.0 : ((xn >= 0 ? -1.0 : 1.0) * an);
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
            default: { // case erule::localpb:
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return ((xn >= 0 ? -1.0 : 1.0) * an);
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
        };
    }